

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

int Cec_ManSimSimulateRound(Cec_ManSim_t *p,Vec_Ptr_t *vInfoCis,Vec_Ptr_t *vInfoCos)

{
  ulong uVar1;
  Gia_Rpr_t *pGVar2;
  Vec_Int_t *p_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uint *puVar7;
  Gia_Obj_t *pGVar8;
  void *pvVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  long lVar13;
  int i;
  long lVar14;
  Gia_Man_t *pGVar15;
  float Mem;
  
  if (p->nWordsOld != p->nWords) {
    Cec_ManSimMemRelink(p);
  }
  p->nMemsMax = 0;
  if (p->pScores != (int *)0x0) {
    free(p->pScores);
    p->pScores = (int *)0x0;
  }
  if (p->pBestState != (Abc_Cex_t *)0x0) {
    piVar6 = (int *)calloc((long)p->nWords << 5,4);
    p->pScores = piVar6;
  }
  p->vRefinedC->nSize = 0;
  if (p->pAig->pObjs->Value != 0) {
    puVar7 = Cec_ManSimSimRef(p,0);
    for (lVar14 = 1; lVar14 <= p->nWords; lVar14 = lVar14 + 1) {
      puVar7[lVar14] = 0;
    }
  }
  i = 0;
  iVar5 = 0;
  for (lVar14 = 1; lVar14 < p->pAig->nObjs; lVar14 = lVar14 + 1) {
    iVar4 = (int)lVar14;
    pGVar8 = Gia_ManObj(p->pAig,iVar4);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    uVar12 = (uint)*(undefined8 *)pGVar8;
    if ((~uVar12 & 0x9fffffff) == 0) {
      if (pGVar8->Value == 0) {
        i = i + 1;
      }
      else {
        puVar7 = Cec_ManSimSimRef(p,iVar4);
        if (vInfoCis == (Vec_Ptr_t *)0x0) {
          for (lVar13 = 1; lVar13 <= p->nWords; lVar13 = lVar13 + 1) {
            uVar12 = Gia_ManRandom(0);
            puVar7[lVar13] = uVar12;
          }
        }
        else {
          pvVar9 = Vec_PtrEntry(vInfoCis,i);
          for (lVar13 = 1; lVar13 <= p->nWords; lVar13 = lVar13 + 1) {
            puVar7[lVar13] = *(uint *)((long)pvVar9 + lVar13 * 4 + -4);
          }
          i = i + 1;
        }
        *(byte *)(puVar7 + 1) = (byte)puVar7[1] & 0xfe;
LAB_004d0d46:
        if (((uint)p->pAig->pReprs[lVar14] & 0xfffffff) == 0) {
          iVar3 = Cec_ManSimCompareConst(puVar7 + 1,p->nWords);
          if (iVar3 == 0) {
            *puVar7 = *puVar7 + 1;
            Vec_IntPush(p->vRefinedC,iVar4);
            if (p->pBestState != (Abc_Cex_t *)0x0) {
              Cec_ManSimCompareConstScore(puVar7 + 1,p->nWords,p->pScores);
            }
          }
        }
        pGVar15 = p->pAig;
        iVar4 = Gia_ObjIsClass(pGVar15,iVar4);
        if (iVar4 != 0) {
          *puVar7 = *puVar7 + 1;
        }
        pGVar2 = pGVar15->pReprs;
        uVar12 = (uint)pGVar2[lVar14] & 0xfffffff;
        if (((uVar12 != 0) && (uVar12 != 0xfffffff)) && (pGVar15->pNexts[lVar14] == 0)) {
          p->vClassTemp->nSize = 0;
          uVar12 = (uint)pGVar2[lVar14] & 0xfffffff;
          iVar4 = Gia_ObjIsHead(pGVar15,uVar12);
          if (iVar4 == 0) {
            __assert_fail("Gia_ObjIsHead(p->pAig, Gia_ObjRepr(p->pAig, i))",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                          ,0x2f3,
                          "int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
          }
          for (; uVar12 != 0; uVar12 = pGVar15->pNexts[(int)uVar12]) {
            Vec_IntPush(p->vClassTemp,uVar12);
            pGVar15 = p->pAig;
          }
          Cec_ManSimClassRefineOne(p,(uint)pGVar15->pReprs[lVar14] & 0xfffffff);
          for (iVar4 = 0; iVar4 < p->vClassTemp->nSize; iVar4 = iVar4 + 1) {
            iVar3 = Vec_IntEntry(p->vClassTemp,iVar4);
            Cec_ManSimSimDeref(p,iVar3);
          }
        }
      }
    }
    else {
      if ((~uVar12 & 0x1fffffff) == 0 || -1 < (int)uVar12) {
        if (pGVar8->Value == 0) {
          __assert_fail("Gia_ObjValue(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                        ,0x2c9,
                        "int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
        }
        puVar7 = Cec_ManSimSimRef(p,iVar4);
        puVar10 = Cec_ManSimSimDeref(p,iVar4 - (*(uint *)pGVar8 & 0x1fffffff));
        puVar11 = Cec_ManSimSimDeref(p,iVar4 - (*(uint *)&pGVar8->field_0x4 & 0x1fffffff));
        uVar1 = *(ulong *)pGVar8;
        if (((uint)uVar1 >> 0x1d & 1) == 0) {
          if ((uVar1 >> 0x3d & 1) == 0) {
            for (lVar13 = 1; lVar13 <= p->nWords; lVar13 = lVar13 + 1) {
              puVar7[lVar13] = puVar11[lVar13] & puVar10[lVar13];
            }
          }
          else {
            for (lVar13 = 1; lVar13 <= p->nWords; lVar13 = lVar13 + 1) {
              puVar7[lVar13] = ~puVar11[lVar13] & puVar10[lVar13];
            }
          }
        }
        else if ((uVar1 >> 0x3d & 1) == 0) {
          for (lVar13 = 1; lVar13 <= p->nWords; lVar13 = lVar13 + 1) {
            puVar7[lVar13] = ~puVar10[lVar13] & puVar11[lVar13];
          }
        }
        else {
          for (lVar13 = 1; lVar13 <= p->nWords; lVar13 = lVar13 + 1) {
            puVar7[lVar13] = ~(puVar11[lVar13] | puVar10[lVar13]);
          }
        }
        goto LAB_004d0d46;
      }
      puVar7 = Cec_ManSimSimDeref(p,iVar4 - (uVar12 & 0x1fffffff));
      if (vInfoCos != (Vec_Ptr_t *)0x0) {
        iVar4 = iVar5 + 1;
        pvVar9 = Vec_PtrEntry(vInfoCos,iVar5);
        iVar5 = iVar4;
        if ((pGVar8->field_0x3 & 0x20) == 0) {
          for (lVar13 = 1; lVar13 <= p->nWords; lVar13 = lVar13 + 1) {
            *(uint *)((long)pvVar9 + lVar13 * 4 + -4) = puVar7[lVar13];
          }
        }
        else {
          for (lVar13 = 1; lVar13 <= p->nWords; lVar13 = lVar13 + 1) {
            *(uint *)((long)pvVar9 + lVar13 * 4 + -4) = ~puVar7[lVar13];
          }
        }
      }
    }
  }
  if (p->pPars->fConstCorr == 0) {
    if (0 < p->vRefinedC->nSize) {
      Cec_ManSimProcessRefined(p,p->vRefinedC);
    }
  }
  else {
    for (iVar4 = 0; p_00 = p->vRefinedC, iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
      iVar3 = Vec_IntEntry(p_00,iVar4);
      pGVar2 = p->pAig->pReprs + iVar3;
      *pGVar2 = (Gia_Rpr_t)((uint)*pGVar2 | 0xfffffff);
      Cec_ManSimSimDeref(p,iVar3);
    }
    p_00->nSize = 0;
  }
  if ((vInfoCis != (Vec_Ptr_t *)0x0) && (i != p->pAig->vCis->nSize)) {
    __assert_fail("vInfoCis == NULL || iCiId == Gia_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x307,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if ((vInfoCos != (Vec_Ptr_t *)0x0) && (iVar5 != p->pAig->vCos->nSize)) {
    __assert_fail("vInfoCos == NULL || iCoId == Gia_ManCoNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x308,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (p->nMems != 1) {
    __assert_fail("p->nMems == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x309,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (p->pPars->fVeryVerbose != 0) {
    pGVar15 = p->pAig;
    Mem = Cec_MemUsage(p);
    Gia_ManEquivPrintClasses(pGVar15,0,Mem);
  }
  if (p->pBestState != (Abc_Cex_t *)0x0) {
    Cec_ManSimFindBestPattern(p);
  }
  iVar5 = Cec_ManSimAnalyzeOutputs(p);
  return iVar5;
}

Assistant:

int Cec_ManSimSimulateRound( Cec_ManSim_t * p, Vec_Ptr_t * vInfoCis, Vec_Ptr_t * vInfoCos )
{
    Gia_Obj_t * pObj;
    unsigned * pRes0, * pRes1, * pRes;
    int i, k, w, Ent, iCiId = 0, iCoId = 0;
    // prepare internal storage
    if ( p->nWordsOld != p->nWords )
        Cec_ManSimMemRelink( p );
    p->nMemsMax = 0;
    // allocate score counters
    ABC_FREE( p->pScores );
    if ( p->pBestState )
        p->pScores = ABC_CALLOC( int, 32 * p->nWords );
    // simulate nodes
    Vec_IntClear( p->vRefinedC );
    if ( Gia_ObjValue(Gia_ManConst0(p->pAig)) )
    {
        pRes = Cec_ManSimSimRef( p, 0 );
        for ( w = 1; w <= p->nWords; w++ )
            pRes[w] = 0;
    }
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) ) 
        {
            if ( Gia_ObjValue(pObj) == 0 )
            {
                iCiId++;
                continue;
            }
            pRes = Cec_ManSimSimRef( p, i );
            if ( vInfoCis ) 
            {
                pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, iCiId++ );
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w-1];
            }
            else
            {
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = Gia_ManRandom( 0 );
            }
            // make sure the first pattern is always zero
            pRes[1] ^= (pRes[1] & 1);
            goto references;
        }
        if ( Gia_ObjIsCo(pObj) ) // co always has non-zero 1st fanin and zero 2nd fanin
        {
            pRes0 = Cec_ManSimSimDeref( p, Gia_ObjFaninId0(pObj,i) );
            if ( vInfoCos )
            {
                pRes = (unsigned *)Vec_PtrEntry( vInfoCos, iCoId++ );
                if ( Gia_ObjFaninC0(pObj) )
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w-1] = ~pRes0[w];
                else 
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w-1] = pRes0[w];
            }
            continue;
        }
        assert( Gia_ObjValue(pObj) );
        pRes  = Cec_ManSimSimRef( p, i );
        pRes0 = Cec_ManSimSimDeref( p, Gia_ObjFaninId0(pObj,i) );
        pRes1 = Cec_ManSimSimDeref( p, Gia_ObjFaninId1(pObj,i) );

//        Abc_Print( 1, "%d,%d  ", Gia_ObjValue( Gia_ObjFanin0(pObj) ), Gia_ObjValue( Gia_ObjFanin1(pObj) ) );

        if ( Gia_ObjFaninC0(pObj) )
        {
            if ( Gia_ObjFaninC1(pObj) )
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = ~(pRes0[w] | pRes1[w]);
            else
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = ~pRes0[w] & pRes1[w];
        }
        else
        {
            if ( Gia_ObjFaninC1(pObj) )
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w] & ~pRes1[w];
            else
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w] & pRes1[w];
        }

references:
        // if this node is candidate constant, collect it
        if ( Gia_ObjIsConst(p->pAig, i) && !Cec_ManSimCompareConst(pRes + 1, p->nWords) )
        {
            pRes[0]++;
            Vec_IntPush( p->vRefinedC, i );
            if ( p->pBestState )
                Cec_ManSimCompareConstScore( pRes + 1, p->nWords, p->pScores );
        }
        // if the node belongs to a class, save it
        if ( Gia_ObjIsClass(p->pAig, i) )
            pRes[0]++;
        // if this is the last node of the class, process it
        if ( Gia_ObjIsTail(p->pAig, i) )
        {
            Vec_IntClear( p->vClassTemp );
            Gia_ClassForEachObj( p->pAig, Gia_ObjRepr(p->pAig, i), Ent )
                Vec_IntPush( p->vClassTemp, Ent );
            Cec_ManSimClassRefineOne( p, Gia_ObjRepr(p->pAig, i) );
            Vec_IntForEachEntry( p->vClassTemp, Ent, k )
                Cec_ManSimSimDeref( p, Ent );
        }
    }

    if ( p->pPars->fConstCorr )
    {
        Vec_IntForEachEntry( p->vRefinedC, i, k )
        {
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
            Cec_ManSimSimDeref( p, i );
        }
        Vec_IntClear( p->vRefinedC );
    }

    if ( Vec_IntSize(p->vRefinedC) > 0 )
        Cec_ManSimProcessRefined( p, p->vRefinedC );
    assert( vInfoCis == NULL || iCiId == Gia_ManCiNum(p->pAig) );
    assert( vInfoCos == NULL || iCoId == Gia_ManCoNum(p->pAig) );
    assert( p->nMems == 1 );
    if ( p->nMems != 1 )
        Abc_Print( 1, "Cec_ManSimSimulateRound(): Memory management error!\n" );
    if ( p->pPars->fVeryVerbose )
        Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
    if ( p->pBestState )
        Cec_ManSimFindBestPattern( p );
/*
    if ( p->nMems > 1 ) {
        for ( i = 1; i < p->nObjs; i++ )
        if ( p->pSims[i] ) {
            int x = 0;
        }
    }
*/
    return Cec_ManSimAnalyzeOutputs( p );
}